

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FragmentStamp.cpp
# Opt level: O0

vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> * __thiscall
OpenMD::FragmentStamp::getJointAtoms(FragmentStamp *this,int rb1,int rb2)

{
  int iVar1;
  size_t sVar2;
  size_t sVar3;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *in_RDI;
  int j;
  int i;
  int atomIndex2;
  int atomIndex1;
  int natomInRb2;
  int natomInRb1;
  RigidBodyStamp *rbStamp2;
  RigidBodyStamp *rbStamp1;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *jointAtomIndexPair;
  pair<int,_int> in_stack_ffffffffffffff58;
  int in_stack_ffffffffffffff60;
  int in_stack_ffffffffffffff64;
  undefined4 local_54;
  undefined4 local_50;
  
  std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::vector
            ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)0x3ec2b9);
  getRigidBodyStamp((FragmentStamp *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                    in_stack_ffffffffffffff58.second);
  sVar2 = RigidBodyStamp::getNMembers((RigidBodyStamp *)0x3ec2eb);
  getRigidBodyStamp((FragmentStamp *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                    in_stack_ffffffffffffff58.second);
  sVar3 = RigidBodyStamp::getNMembers((RigidBodyStamp *)0x3ec32d);
  local_50 = 0;
  do {
    if ((int)sVar2 <= local_50) {
      return in_RDI;
    }
    iVar1 = RigidBodyStamp::getMemberAt
                      ((RigidBodyStamp *)
                       CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                       in_stack_ffffffffffffff58.second);
    in_stack_ffffffffffffff64 = iVar1;
    for (local_54 = 0; local_54 < (int)sVar3; local_54 = local_54 + 1) {
      in_stack_ffffffffffffff60 =
           RigidBodyStamp::getMemberAt
                     ((RigidBodyStamp *)
                      CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                      in_stack_ffffffffffffff58.second);
      if (iVar1 == in_stack_ffffffffffffff60) {
        in_stack_ffffffffffffff58 =
             std::make_pair<int&,int&>((int *)in_stack_ffffffffffffff58,(int *)0x3ec3c0);
        std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::push_back
                  ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                   CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                   (value_type *)in_stack_ffffffffffffff58);
        break;
      }
    }
    local_50 = local_50 + 1;
  } while( true );
}

Assistant:

std::vector<std::pair<int, int>> FragmentStamp::getJointAtoms(int rb1,
                                                                int rb2) {
    RigidBodyStamp* rbStamp1;
    RigidBodyStamp* rbStamp2;
    int natomInRb1;
    int natomInRb2;
    int atomIndex1;
    int atomIndex2;
    std::vector<std::pair<int, int>> jointAtomIndexPair;

    rbStamp1   = this->getRigidBodyStamp(rb1);
    natomInRb1 = rbStamp1->getNMembers();

    rbStamp2   = this->getRigidBodyStamp(rb2);
    natomInRb2 = rbStamp2->getNMembers();

    for (int i = 0; i < natomInRb1; i++) {
      atomIndex1 = rbStamp1->getMemberAt(i);

      for (int j = 0; j < natomInRb2; j++) {
        atomIndex2 = rbStamp2->getMemberAt(j);

        if (atomIndex1 == atomIndex2) {
          jointAtomIndexPair.push_back(std::make_pair(i, j));
          break;
        }
      }
    }

    return jointAtomIndexPair;
  }